

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O2

bool __thiscall Refal2::CRuleParser::BeginFunction(CRuleParser *this)

{
  CToken *nameToken;
  TLabel TVar1;
  
  if (((this->super_CQualifierParser).token.type == TT_Word) &&
     ((this->super_CQualifierParser).token.word._M_string_length != 0)) {
    nameToken = &(this->super_CQualifierParser).token;
    TVar1 = CModuleBuilder::Declare((CModuleBuilder *)this,nameToken);
    if (TVar1 != -1) {
      CToken::operator=(&this->functionName,nameToken);
      beginRule(this);
    }
    return TVar1 != -1;
  }
  __assert_fail("token.type == TT_Word && !token.word.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                ,0x19,"bool Refal2::CRuleParser::BeginFunction()");
}

Assistant:

bool CRuleParser::BeginFunction()
{
	assert( token.type == TT_Word && !token.word.empty() );
	if( CModuleBuilder::Declare( token ) != InvalidDictionaryIndex ) {
		functionName = token;
		beginRule();
		return true;
	}
	return false;
}